

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_list_append(DsList *list,void *data)

{
  DS_STATUS DVar1;
  DsListEntry *in_00;
  DsListEntry *in;
  void *data_local;
  DsList *list_local;
  
  if (list == (DsList *)0x0) {
    list_local._4_4_ = DS_STATUS_NULL;
  }
  else {
    in_00 = (DsListEntry *)malloc(0x18);
    if (in_00 == (DsListEntry *)0x0) {
      list_local._4_4_ = DS_STATUS_OUTMEM;
    }
    else {
      in_00->data = data;
      in_00->next = (DsListEntry *)0x0;
      in_00->prev = (DsListEntry *)0x0;
      DVar1 = ds_entry_append(&list->entry,in_00);
      if (DVar1 == DS_STATUS_OK) {
        list->size = list->size + 1;
        list_local._4_4_ = DS_STATUS_OK;
      }
      else {
        free(in_00);
        list_local._4_4_ = DS_STATUS_NULL;
      }
    }
  }
  return list_local._4_4_;
}

Assistant:

DS_STATUS ds_list_append(DsList *list, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    if (DS_STATUS_OK != ds_entry_append(&list->entry, in))
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}